

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsAnalytic_mels.c
# Opt level: O2

int main(void)

{
  undefined8 *puVar1;
  int iVar2;
  int iVar3;
  long *returnvalue;
  void *returnvalue_00;
  undefined8 *returnvalue_01;
  double dVar4;
  double dVar5;
  int retval;
  sunrealtype t;
  double local_98;
  undefined8 uStack_90;
  void *cvode_mem;
  undefined8 *local_80;
  long netf;
  long ncfn;
  long nni;
  long nsetups;
  long nfe;
  long nst;
  sunrealtype lambda;
  long nfeLS;
  long nje;
  
  lambda = -100.0;
  cvode_mem = (void *)0x0;
  puts("\nAnalytical ODE test problem:");
  printf("   lambda = %g\n",0xc059000000000000);
  printf("   reltol = %.1e\n",0x3eb0c6f7a0b5ed8d);
  printf("   abstol = %.1e\n\n",0x3ddb7cdfd9d7bdbb);
  retval = SUNContext_Create(0,&sunctx);
  iVar3 = 1;
  iVar2 = check_retval(&retval,"SUNContext_Create",1);
  if (iVar2 == 0) {
    returnvalue = (long *)N_VNew_Serial(1,sunctx);
    iVar2 = check_retval(returnvalue,"N_VNew_Serial",0);
    if (iVar2 == 0) {
      N_VConst(0,returnvalue);
      returnvalue_00 = (void *)CVodeCreate(2,sunctx);
      cvode_mem = returnvalue_00;
      iVar2 = check_retval(returnvalue_00,"CVodeCreate",0);
      if (iVar2 == 0) {
        retval = CVodeInit(0,returnvalue_00,f,returnvalue);
        iVar2 = check_retval(&retval,"CVodeInit",1);
        iVar3 = 1;
        if (iVar2 == 0) {
          retval = CVodeSetUserData(returnvalue_00,&lambda);
          iVar2 = check_retval(&retval,"CVodeSetUserData",1);
          iVar3 = 1;
          if (iVar2 == 0) {
            retval = CVodeSStolerances(0x3eb0c6f7a0b5ed8d,0x3ddb7cdfd9d7bdbb,returnvalue_00);
            iVar2 = check_retval(&retval,"CVodeSStolerances",1);
            iVar3 = 1;
            if (iVar2 == 0) {
              returnvalue_01 = (undefined8 *)SUNLinSolNewEmpty(sunctx);
              if (returnvalue_01 != (undefined8 *)0x0) {
                puVar1 = (undefined8 *)returnvalue_01[1];
                *puVar1 = MatrixEmbeddedLSType;
                puVar1[8] = MatrixEmbeddedLSSolve;
                puVar1[0xe] = MatrixEmbeddedLSFree;
                *returnvalue_01 = returnvalue_00;
              }
              iVar2 = check_retval(returnvalue_01,"MatrixEmbeddedLS",0);
              if (iVar2 == 0) {
                retval = CVodeSetLinearSolver(returnvalue_00,returnvalue_01,0);
                iVar2 = check_retval(&retval,"CVodeSetLinearSolver",1);
                iVar3 = 1;
                if (iVar2 == 0) {
                  t = 0.0;
                  local_80 = returnvalue_01;
                  puts("        t           u");
                  puts("   ---------------------");
                  dVar5 = 0.0;
                  local_98 = 1.0;
                  while (1e-15 < 10.0 - dVar5) {
                    retval = CVode(local_98,returnvalue_00,returnvalue,&t,1);
                    iVar3 = check_retval(&retval,"CVode",1);
                    if (iVar3 != 0) break;
                    printf("  %10.6f  %10.6f\n",t,**(undefined8 **)(*returnvalue + 0x10));
                    if (retval < 0) {
                      fwrite("Solver failure, stopping integration\n",0x25,1,_stderr);
                      break;
                    }
                    dVar4 = local_98 + 1.0;
                    dVar5 = t;
                    local_98 = 10.0;
                    if (dVar4 <= 10.0) {
                      local_98 = dVar4;
                    }
                  }
                  puts("   ---------------------");
                  retval = CVodeGetNumSteps(returnvalue_00,&nst);
                  check_retval(&retval,"CVodeGetNumSteps",1);
                  retval = CVodeGetNumRhsEvals(returnvalue_00,&nfe);
                  check_retval(&retval,"CVodeGetNumRhsEvals",1);
                  retval = CVodeGetNumLinSolvSetups(returnvalue_00,&nsetups);
                  check_retval(&retval,"CVodeGetNumLinSolvSetups",1);
                  retval = CVodeGetNumErrTestFails(returnvalue_00,&netf);
                  check_retval(&retval,"CVodeGetNumErrTestFails",1);
                  retval = CVodeGetNumNonlinSolvIters(returnvalue_00,&nni);
                  check_retval(&retval,"CVodeGetNumNonlinSolvIters",1);
                  retval = CVodeGetNumNonlinSolvConvFails(returnvalue_00,&ncfn);
                  check_retval(&retval,"CVodeGetNumNonlinSolvConvFails",1);
                  retval = CVodeGetNumJacEvals(returnvalue_00,&nje);
                  check_retval(&retval,"CVodeGetNumJacEvals",1);
                  retval = CVodeGetNumLinRhsEvals(returnvalue_00,&nfeLS);
                  check_retval(&retval,"CVodeGetNumLinRhsEvals",1);
                  puts("\nFinal Solver Statistics:");
                  printf("   Internal solver steps = %li\n",nst);
                  printf("   Total RHS evals = %li\n",nfe);
                  printf("   Total linear solver setups = %li\n",nsetups);
                  printf("   Total RHS evals for setting up the linear system = %li\n",nfeLS);
                  printf("   Total number of Jacobian evaluations = %li\n",nje);
                  printf("   Total number of Newton iterations = %li\n",nni);
                  printf("   Total number of linear solver convergence failures = %li\n",ncfn);
                  printf("   Total number of error test failures = %li\n\n",netf);
                  dVar5 = atan(t);
                  dVar5 = ABS(**(double **)(*returnvalue + 0x10) - dVar5) *
                          (1.0 / (ABS(dVar5) * 1e-06 + 1e-10));
                  if (1.0 <= dVar5) {
                    uStack_90 = 0;
                    local_98 = dVar5;
                    fprintf(_stdout,"\nSUNDIALS_WARNING: check_ans error=%g\n\n",dVar5);
                    dVar5 = local_98;
                  }
                  retval = (int)(1.0 <= dVar5);
                  N_VDestroy(returnvalue);
                  CVodeFree(&cvode_mem);
                  SUNLinSolFree(local_80);
                  SUNContext_Free(&sunctx);
                  iVar3 = retval;
                }
              }
            }
          }
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int main(void)
{
  /* general problem parameters */
  sunrealtype T0     = SUN_RCONST(0.0);    /* initial time */
  sunrealtype Tf     = SUN_RCONST(10.0);   /* final time */
  sunrealtype dTout  = SUN_RCONST(1.0);    /* time between outputs */
  sunindextype NEQ   = 1;                  /* number of dependent vars. */
  sunrealtype reltol = SUN_RCONST(1.0e-6); /* tolerances */
  sunrealtype abstol = SUN_RCONST(1.0e-10);
  sunrealtype lambda = SUN_RCONST(-100.0); /* stiffness parameter */

  /* general problem variables */
  int retval;                /* reusable error-checking flag */
  N_Vector y         = NULL; /* empty vector for storing solution */
  SUNLinearSolver LS = NULL; /* empty linear solver object */
  void* cvode_mem    = NULL; /* empty CVode memory structure */
  sunrealtype t, tout;
  long int nst, nfe, nsetups, nje, nfeLS, nni, ncfn, netf;

  /* Initial diagnostics output */
  printf("\nAnalytical ODE test problem:\n");
  printf("   lambda = %" GSYM "\n", lambda);
  printf("   reltol = %.1" ESYM "\n", reltol);
  printf("   abstol = %.1" ESYM "\n\n", abstol);

  /* Create the SUNDIALS simulation context that all SUNDIALS objects require */
  retval = SUNContext_Create(SUN_COMM_NULL, &sunctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return (1); }

  /* Initialize data structures */
  y = N_VNew_Serial(NEQ, sunctx); /* Create serial vector for solution */
  if (check_retval((void*)y, "N_VNew_Serial", 0)) { return 1; }
  N_VConst(SUN_RCONST(0.0), y); /* Specify initial condition */

  /* Call CVodeCreate to create the solver memory and specify the
   * Backward Differentiation Formula */
  cvode_mem = CVodeCreate(CV_BDF, sunctx);
  if (check_retval((void*)cvode_mem, "CVodeCreate", 0)) { return (1); }

  /* Call CVodeInit to initialize the integrator memory and specify the
   * user's right hand side function in y'=f(t,y), the initial time T0, and
   * the initial dependent variable vector y. */
  retval = CVodeInit(cvode_mem, f, T0, y);
  if (check_retval(&retval, "CVodeInit", 1)) { return (1); }

  /* Call CVodeSetUserData to specify the stiffness factor */
  retval = CVodeSetUserData(cvode_mem, (void*)&lambda);
  if (check_retval(&retval, "CVodeSetUserData", 1)) { return (1); }

  /* Call CVodeSStolerances to specify the scalar relative and absolute tolerances */
  retval = CVodeSStolerances(cvode_mem, reltol, abstol);
  if (check_retval(&retval, "CVodeSStolerances", 1)) { return (1); }

  /* Create custom matrix-embedded linear solver */
  LS = MatrixEmbeddedLS(cvode_mem);
  if (check_retval((void*)LS, "MatrixEmbeddedLS", 0)) { return 1; }

  /* Call CVodeSetLinearSolver to attach the linear solver to CVode */
  retval = CVodeSetLinearSolver(cvode_mem, LS, NULL);
  if (check_retval(&retval, "CVodeSetLinearSolver", 1)) { return 1; }

  /* In loop, call CVode, print results, and test for error.
     Break out of loop when NOUT preset output times have been reached.  */
  t    = T0;
  tout = T0 + dTout;
  printf("        t           u\n");
  printf("   ---------------------\n");
  while (Tf - t > 1.0e-15)
  {
    retval = CVode(cvode_mem, tout, y, &t, CV_NORMAL); /* call integrator */
    if (check_retval(&retval, "CVode", 1)) { break; }
    printf("  %10.6" FSYM "  %10.6" FSYM "\n", t,
           NV_Ith_S(y, 0)); /* access/print solution */
    if (retval >= 0)
    { /* successful solve: update time */
      tout += dTout;
      tout = (tout > Tf) ? Tf : tout;
    }
    else
    { /* unsuccessful solve: break */
      fprintf(stderr, "Solver failure, stopping integration\n");
      break;
    }
  }
  printf("   ---------------------\n");

  /* Get/print some final statistics on how the solve progressed */
  retval = CVodeGetNumSteps(cvode_mem, &nst);
  check_retval(&retval, "CVodeGetNumSteps", 1);
  retval = CVodeGetNumRhsEvals(cvode_mem, &nfe);
  check_retval(&retval, "CVodeGetNumRhsEvals", 1);
  retval = CVodeGetNumLinSolvSetups(cvode_mem, &nsetups);
  check_retval(&retval, "CVodeGetNumLinSolvSetups", 1);
  retval = CVodeGetNumErrTestFails(cvode_mem, &netf);
  check_retval(&retval, "CVodeGetNumErrTestFails", 1);
  retval = CVodeGetNumNonlinSolvIters(cvode_mem, &nni);
  check_retval(&retval, "CVodeGetNumNonlinSolvIters", 1);
  retval = CVodeGetNumNonlinSolvConvFails(cvode_mem, &ncfn);
  check_retval(&retval, "CVodeGetNumNonlinSolvConvFails", 1);
  retval = CVodeGetNumJacEvals(cvode_mem, &nje);
  check_retval(&retval, "CVodeGetNumJacEvals", 1);
  retval = CVodeGetNumLinRhsEvals(cvode_mem, &nfeLS);
  check_retval(&retval, "CVodeGetNumLinRhsEvals", 1);

  printf("\nFinal Solver Statistics:\n");
  printf("   Internal solver steps = %li\n", nst);
  printf("   Total RHS evals = %li\n", nfe);
  printf("   Total linear solver setups = %li\n", nsetups);
  printf("   Total RHS evals for setting up the linear system = %li\n", nfeLS);
  printf("   Total number of Jacobian evaluations = %li\n", nje);
  printf("   Total number of Newton iterations = %li\n", nni);
  printf("   Total number of linear solver convergence failures = %li\n", ncfn);
  printf("   Total number of error test failures = %li\n\n", netf);

  /* check the solution error */
  retval = check_ans(y, t, reltol, abstol);

  /* Clean up and return */
  N_VDestroy(y);         /* Free y vector */
  CVodeFree(&cvode_mem); /* Free integrator memory */
  SUNLinSolFree(LS);     /* Free linear solver */
  SUNContext_Free(&sunctx);

  return retval;
}